

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::ApplyRowPermutation(Matrix *this,Permutation *permutation)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int local_64;
  int i;
  bool answer;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  local_50;
  undefined1 local_38 [8];
  Matrix result;
  Permutation *permutation_local;
  Matrix *this_local;
  
  result.elements_.
  super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)permutation;
  iVar2 = Permutation::Size(permutation);
  if (iVar2 == this->n_) {
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::vector(&local_50,&this->elements_);
    Matrix((Matrix *)local_38,&local_50);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_50);
    bVar3 = false;
    for (local_64 = 0; local_64 < this->n_; local_64 = local_64 + 1) {
      iVar2 = Permutation::At((Permutation *)
                              result.elements_.
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_64);
      bVar1 = CopyRow((Matrix *)local_38,this,iVar2,local_64);
      bVar3 = bVar3 || bVar1;
    }
    operator=(this,(Matrix *)local_38);
    ~Matrix((Matrix *)local_38);
    return bVar3;
  }
  __assert_fail("permutation.Size() == n_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x119,"bool Matrix::ApplyRowPermutation(const Permutation &)");
}

Assistant:

bool Matrix::ApplyRowPermutation(const Permutation& permutation) {
  assert(permutation.Size() == n_);
  Matrix result(elements_);
  bool answer = false;
  for (int i = 0; i < n_; ++i) {
    answer |= result.CopyRow(*this, permutation.At(i), i);
  }
  operator=(result);

  return answer;
}